

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O1

void FreeContent(SUNNonlinearSolver NLS)

{
  N_Vector p_Var1;
  void *pvVar2;
  N_Vector *pp_Var3;
  
  p_Var1 = *(N_Vector *)((long)NLS->content + 0x68);
  if (p_Var1 != (N_Vector)0x0) {
    N_VDestroy(p_Var1);
    *(undefined8 *)((long)NLS->content + 0x68) = 0;
  }
  p_Var1 = *(N_Vector *)((long)NLS->content + 0x70);
  if (p_Var1 != (N_Vector)0x0) {
    N_VDestroy(p_Var1);
    *(undefined8 *)((long)NLS->content + 0x70) = 0;
  }
  p_Var1 = *(N_Vector *)((long)NLS->content + 0x78);
  if (p_Var1 != (N_Vector)0x0) {
    N_VDestroy(p_Var1);
    *(undefined8 *)((long)NLS->content + 0x78) = 0;
  }
  p_Var1 = *(N_Vector *)((long)NLS->content + 0x80);
  if (p_Var1 != (N_Vector)0x0) {
    N_VDestroy(p_Var1);
    *(undefined8 *)((long)NLS->content + 0x80) = 0;
  }
  p_Var1 = *(N_Vector *)((long)NLS->content + 0x88);
  if (p_Var1 != (N_Vector)0x0) {
    N_VDestroy(p_Var1);
    *(undefined8 *)((long)NLS->content + 0x88) = 0;
  }
  pvVar2 = *(void **)((long)NLS->content + 0x18);
  if (pvVar2 != (void *)0x0) {
    free(pvVar2);
    *(undefined8 *)((long)NLS->content + 0x18) = 0;
  }
  pvVar2 = *(void **)((long)NLS->content + 0x30);
  if (pvVar2 != (void *)0x0) {
    free(pvVar2);
    *(undefined8 *)((long)NLS->content + 0x30) = 0;
  }
  pvVar2 = *(void **)((long)NLS->content + 0x38);
  if (pvVar2 != (void *)0x0) {
    free(pvVar2);
    *(undefined8 *)((long)NLS->content + 0x38) = 0;
  }
  pvVar2 = *(void **)((long)NLS->content + 0x40);
  if (pvVar2 != (void *)0x0) {
    free(pvVar2);
    *(undefined8 *)((long)NLS->content + 0x40) = 0;
  }
  pp_Var3 = *(N_Vector **)((long)NLS->content + 0x48);
  if (pp_Var3 != (N_Vector *)0x0) {
    N_VDestroyVectorArray(pp_Var3,*(int *)((long)NLS->content + 0x10));
    *(undefined8 *)((long)NLS->content + 0x48) = 0;
  }
  pp_Var3 = *(N_Vector **)((long)NLS->content + 0x50);
  if (pp_Var3 != (N_Vector *)0x0) {
    N_VDestroyVectorArray(pp_Var3,*(int *)((long)NLS->content + 0x10));
    *(undefined8 *)((long)NLS->content + 0x50) = 0;
  }
  pp_Var3 = *(N_Vector **)((long)NLS->content + 0x58);
  if (pp_Var3 != (N_Vector *)0x0) {
    N_VDestroyVectorArray(pp_Var3,*(int *)((long)NLS->content + 0x10));
    *(undefined8 *)((long)NLS->content + 0x58) = 0;
  }
  pvVar2 = *(void **)((long)NLS->content + 0x60);
  if (pvVar2 != (void *)0x0) {
    free(pvVar2);
    *(undefined8 *)((long)NLS->content + 0x60) = 0;
  }
  return;
}

Assistant:

static void FreeContent(SUNNonlinearSolver NLS)
{
  if (FP_CONTENT(NLS)->yprev) {
    N_VDestroy(FP_CONTENT(NLS)->yprev);
    FP_CONTENT(NLS)->yprev = NULL; }

  if (FP_CONTENT(NLS)->gy) {
    N_VDestroy(FP_CONTENT(NLS)->gy);
    FP_CONTENT(NLS)->gy = NULL; }

  if (FP_CONTENT(NLS)->fold) {
    N_VDestroy(FP_CONTENT(NLS)->fold);
    FP_CONTENT(NLS)->fold = NULL; }

  if (FP_CONTENT(NLS)->gold) {
    N_VDestroy(FP_CONTENT(NLS)->gold);
    FP_CONTENT(NLS)->gold = NULL; }

  if (FP_CONTENT(NLS)->delta) {
    N_VDestroy(FP_CONTENT(NLS)->delta);
    FP_CONTENT(NLS)->delta = NULL; }

  if (FP_CONTENT(NLS)->imap) {
    free(FP_CONTENT(NLS)->imap);
    FP_CONTENT(NLS)->imap = NULL; }

  if (FP_CONTENT(NLS)->R) {
    free(FP_CONTENT(NLS)->R);
    FP_CONTENT(NLS)->R = NULL; }

  if (FP_CONTENT(NLS)->gamma) {
    free(FP_CONTENT(NLS)->gamma);
    FP_CONTENT(NLS)->gamma = NULL; }

  if (FP_CONTENT(NLS)->cvals) {
    free(FP_CONTENT(NLS)->cvals);
    FP_CONTENT(NLS)->cvals = NULL; }

  if (FP_CONTENT(NLS)->df) {
    N_VDestroyVectorArray(FP_CONTENT(NLS)->df, FP_CONTENT(NLS)->m);
    FP_CONTENT(NLS)->df = NULL; }

  if (FP_CONTENT(NLS)->dg) {
    N_VDestroyVectorArray(FP_CONTENT(NLS)->dg, FP_CONTENT(NLS)->m);
    FP_CONTENT(NLS)->dg = NULL; }

  if (FP_CONTENT(NLS)->q) {
    N_VDestroyVectorArray(FP_CONTENT(NLS)->q, FP_CONTENT(NLS)->m);
    FP_CONTENT(NLS)->q = NULL; }

  if (FP_CONTENT(NLS)->Xvecs) {
    free(FP_CONTENT(NLS)->Xvecs);
    FP_CONTENT(NLS)->Xvecs = NULL; }

  return;
}